

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetWaveformAndSpectrumSub
               (double *x,int x_length,int y_length,double actual_fs,int decimation_ratio,double *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  long in_R8;
  double dVar7;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  double *new_x;
  int i_1;
  double *new_y;
  int new_x_length;
  int lag;
  int i;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_44;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_ECX == 1) {
    for (iVar8 = 0; iVar8 < in_ESI; iVar8 = iVar8 + 1) {
      *(undefined8 *)(in_R8 + (long)iVar8 * 8) = in_RDI[iVar8];
    }
  }
  else {
    dVar7 = ceil(140.0 / (double)in_ECX);
    iVar8 = (int)(dVar7 * (double)in_ECX);
    iVar3 = in_ESI + iVar8 * 2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
      *(undefined8 *)((long)pvVar5 + (long)local_44 * 8) = 0;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)iVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar6 = operator_new__(uVar4);
    for (local_54 = 0; local_58 = iVar8, local_54 < iVar8; local_54 = local_54 + 1) {
      *(undefined8 *)((long)pvVar6 + (long)local_54 * 8) = *in_RDI;
    }
    for (; local_58 < iVar8 + in_ESI; local_58 = local_58 + 1) {
      *(undefined8 *)((long)pvVar6 + (long)local_58 * 8) = in_RDI[local_58 - iVar8];
    }
    for (local_5c = iVar8 + in_ESI; local_5c < iVar3; local_5c = local_5c + 1) {
      *(undefined8 *)((long)pvVar6 + (long)local_5c * 8) = in_RDI[in_ESI + -1];
    }
    decimate((double *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(int)((ulong)in_R8 >> 0x20),
             (int)in_R8,(double *)CONCAT44(in_stack_ffffffffffffffd4,iVar8));
    for (local_60 = 0; local_60 < in_EDX; local_60 = local_60 + 1) {
      *(undefined8 *)(in_R8 + (long)local_60 * 8) =
           *(undefined8 *)((long)pvVar5 + (long)(iVar8 / in_ECX + local_60) * 8);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete__(pvVar6);
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
  }
  return;
}

Assistant:

static void GetWaveformAndSpectrumSub(const double *x, int x_length,
    int y_length, double actual_fs, int decimation_ratio, double *y) {
  if (decimation_ratio == 1) {
    for (int i = 0; i < x_length; ++i) y[i] = x[i];
    return;
  }

  int lag =
    static_cast<int>(ceil(140.0 / decimation_ratio) * decimation_ratio);
  int new_x_length = x_length + lag * 2;
  double *new_y = new double[new_x_length];
  for (int i = 0; i < new_x_length; ++i) new_y[i] = 0.0;
  double *new_x = new double[new_x_length];
  for (int i = 0; i < lag; ++i) new_x[i] = x[0];
  for (int i = lag; i < lag + x_length; ++i) new_x[i] = x[i - lag];
  for (int i = lag + x_length; i < new_x_length; ++i)
    new_x[i] = x[x_length - 1];

  decimate(new_x, new_x_length, decimation_ratio, new_y);
  for (int i = 0; i < y_length; ++i) y[i] = new_y[lag / decimation_ratio + i];

  delete[] new_x;
  delete[] new_y;
}